

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory.cc
# Opt level: O1

void __thiscall
bssl::TrustStoreInMemory::AddCertificate
          (TrustStoreInMemory *this,shared_ptr<const_bssl::ParsedCertificate> *cert,
          CertificateTrust *trust)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Entry entry;
  
  this_00 = (cert->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (cert->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (cert->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,bssl::TrustStoreInMemory::Entry>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,bssl::TrustStoreInMemory::Entry>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>,bssl::TrustStoreInMemory::Entry&>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,bssl::TrustStoreInMemory::Entry>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,bssl::TrustStoreInMemory::Entry>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->entries_,0);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void TrustStoreInMemory::AddCertificate(
    std::shared_ptr<const ParsedCertificate> cert,
    const CertificateTrust &trust) {
  Entry entry;
  entry.cert = std::move(cert);
  entry.trust = trust;

  // TODO(mattm): should this check for duplicate certificates?
  entries_.emplace(BytesAsStringView(entry.cert->normalized_subject()), entry);
}